

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalPrinter<(anonymous_namespace)::TestVideoParam>::Print
               (anon_struct_48_8_bb454126_for__M_head_impl *value,ostream *os)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"TestVideoParam { filename:",0x1a);
  __s = value->filename;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," fmt:",5);
  poVar2 = (ostream *)std::ostream::operator<<(os,value->fmt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bit_depth:",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,value->bit_depth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," profile:",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," limit:",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," screen_content:",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," psnr_threshold:",0x10);
  poVar2 = std::ostream::_M_insert<double>(value->psnr_threshold);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," }",2);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }